

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::setSpecConstantId
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,int value)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  char *pcVar2;
  
  if (value < 0x7ff) {
    *(ulong *)&qualifier->field_0x24 =
         *(ulong *)&qualifier->field_0x24 & 0xfff800ffffffffff | (ulong)(value & 0x7ff) << 0x28;
    qualifier->field_0xc = qualifier->field_0xc | 1;
    bVar1 = TIntermediate::addUsedConstantId
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,value);
    if (bVar1) {
      return;
    }
    pcVar2 = "specialization-constant id already used";
  }
  else {
    pcVar2 = "specialization-constant id is too large";
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar2,"constant_id","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::setSpecConstantId(const TSourceLoc& loc, TQualifier& qualifier, int value)
{
    if (value >= (int)TQualifier::layoutSpecConstantIdEnd) {
        error(loc, "specialization-constant id is too large", "constant_id", "");
    } else {
        qualifier.layoutSpecConstantId = value;
        qualifier.specConstant = true;
        if (! intermediate.addUsedConstantId(value))
            error(loc, "specialization-constant id already used", "constant_id", "");
    }
    return;
}